

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

ssize_t write_iso9660_data(archive_write *a,void *buff,size_t s)

{
  archive_write *a_00;
  byte bVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  char *fmt;
  long lVar5;
  long lVar6;
  archive_write *a_01;
  size_t sVar7;
  
  a_00 = (archive_write *)a->format_data;
  if (*(int *)&(a_00->archive).vtable < 0) {
    fmt = "Couldn\'t create temporary file";
    iVar2 = -1;
LAB_00176140:
    archive_set_error(&a->archive,iVar2,fmt);
    s = 0xffffffffffffffe2;
  }
  else {
    sVar7 = s;
    a_01 = a_00;
    if ((*(int *)&(a_00->archive).error_string.s != 0) &&
       (lVar5 = *(long *)(*(long *)(*(long *)&(a_00->archive).archive_format + 0xb0) + 8),
       0x1ffffe < lVar5 + s >> 0xb)) {
      sVar7 = 0xfffff800 - lVar5;
      bVar1 = (byte)a_00[1].archive.read_data_offset;
      if ((bVar1 & 1) != 0) {
        zisofs_detect_magic(a_00,buff,sVar7);
        bVar1 = (byte)a_00[1].archive.read_data_offset;
      }
      if ((bVar1 & 2) == 0) {
        iVar2 = wb_write_to_temp(a,buff,sVar7);
        if (iVar2 != 0) {
          return -0x1e;
        }
        lVar5 = *(long *)&(a_00->archive).archive_format;
        lVar6 = *(long *)(lVar5 + 0xb0);
        lVar3 = *(long *)(lVar6 + 8) + sVar7;
        *(long *)(lVar6 + 8) = lVar3;
      }
      else {
        iVar2 = zisofs_write_to_temp(a,buff,sVar7);
        if (iVar2 != 0) {
          return -0x1e;
        }
        lVar5 = *(long *)&(a_00->archive).archive_format;
        lVar6 = *(long *)(lVar5 + 0xb0);
        lVar3 = *(long *)(lVar6 + 8);
      }
      if (lVar3 % 0x800 != 0) {
        iVar2 = write_null(a,0x800 - lVar3 % 0x800);
        if (iVar2 != 0) {
          return -0x1e;
        }
        lVar5 = *(long *)&(a_00->archive).archive_format;
        lVar6 = *(long *)(lVar5 + 0xb0);
        lVar3 = *(long *)(lVar6 + 8);
      }
      *(int *)(lVar6 + 0x10) = (int)(lVar3 + 0x7ffU >> 0xb);
      plVar4 = (long *)calloc(1,0x20);
      if (plVar4 == (long *)0x0) {
        fmt = "Can\'t allocate content data";
        iVar2 = 0xc;
        goto LAB_00176140;
      }
      buff = (void *)((long)buff + sVar7);
      a_01 = (archive_write *)a->format_data;
      *plVar4 = (long)(a_01[0xbc].archive.read_data_block +
                      (0x10000 - *(long *)&a_01[0xbc].archive.current_codepage));
      *(long **)(lVar6 + 0x18) = plVar4;
      *(long **)(lVar5 + 0xb0) = plVar4;
      a_00[1].client_data = (void *)0x0;
      sVar7 = s - sVar7;
    }
    bVar1 = (byte)a_00[1].archive.read_data_offset;
    if ((bVar1 & 1) != 0) {
      zisofs_detect_magic(a_01,buff,sVar7);
      bVar1 = (byte)a_00[1].archive.read_data_offset;
    }
    if ((bVar1 & 2) == 0) {
      iVar2 = wb_write_to_temp(a,buff,sVar7);
      if (iVar2 != 0) {
        return -0x1e;
      }
      plVar4 = (long *)(*(long *)(*(long *)&(a_00->archive).archive_format + 0xb0) + 8);
      *plVar4 = *plVar4 + sVar7;
    }
    else {
      iVar2 = zisofs_write_to_temp(a,buff,sVar7);
      if (iVar2 != 0) {
        return -0x1e;
      }
    }
  }
  return s;
}

Assistant:

static ssize_t
write_iso9660_data(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	size_t ws;

	if (iso9660->temp_fd < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Couldn't create temporary file");
		return (ARCHIVE_FATAL);
	}

	ws = s;
	if (iso9660->need_multi_extent &&
	    (iso9660->cur_file->cur_content->size + ws) >=
	      (MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE)) {
		struct content *con;
		size_t ts;

		ts = (size_t)(MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE -
		    iso9660->cur_file->cur_content->size);

		if (iso9660->zisofs.detect_magic)
			zisofs_detect_magic(a, buff, ts);

		if (iso9660->zisofs.making) {
			if (zisofs_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} else {
			if (wb_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->cur_file->cur_content->size += ts;
		}

		/* Write padding. */
		if (wb_write_padding_to_temp(a,
		    iso9660->cur_file->cur_content->size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);

		/* Compute the logical block number. */
		iso9660->cur_file->cur_content->blocks = (int)
		    ((iso9660->cur_file->cur_content->size
		     + LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);

		/*
		 * Make next extent.
		 */
		ws -= ts;
		buff = (const void *)(((const unsigned char *)buff) + ts);
		/* Make a content for next extent. */
		con = calloc(1, sizeof(*con));
		if (con == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate content data");
			return (ARCHIVE_FATAL);
		}
		con->offset_of_temp = wb_offset(a);
		iso9660->cur_file->cur_content->next = con;
		iso9660->cur_file->cur_content = con;
#ifdef HAVE_ZLIB_H
		iso9660->zisofs.block_offset = 0;
#endif
	}

	if (iso9660->zisofs.detect_magic)
		zisofs_detect_magic(a, buff, ws);

	if (iso9660->zisofs.making) {
		if (zisofs_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		if (wb_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		iso9660->cur_file->cur_content->size += ws;
	}

	return (s);
}